

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_LOSE_RANDOM_STAT(effect_handler_context_t_conflict *context)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  obj_property *poVar4;
  wchar_t stat;
  
  iVar1 = context->subtype;
  uVar3 = Rand_div(4);
  stat = (int)(uVar3 + iVar1 + 1) % 5;
  _Var2 = player_stat_dec(player,stat,true);
  if (_Var2) {
    poVar4 = lookup_obj_property(1,stat);
    msgt(0x96,"You feel very %s.",poVar4->neg_adj);
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_LOSE_RANDOM_STAT(effect_handler_context_t *context)
{
	int safe_stat = context->subtype;
	int loss_stat = randint1(STAT_MAX - 1);

	/* Avoid the safe stat */
	loss_stat = (loss_stat + safe_stat) % STAT_MAX;

	/* Attempt to reduce the stat */
	if (player_stat_dec(player, loss_stat, true)) {
		msgt(MSG_DRAIN_STAT, "You feel very %s.", desc_stat(loss_stat, false));
	}

	/* ID */
	context->ident = true;

	return (true);
}